

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImDrawChannel * __thiscall
ImVector<ImDrawChannel>::erase_unsorted(ImVector<ImDrawChannel> *this,ImDrawChannel *it)

{
  int iVar1;
  ImDrawChannel *pIVar2;
  int iVar3;
  long lVar4;
  ImDrawChannel *pIVar5;
  bool bVar6;
  ptrdiff_t off;
  ImDrawChannel *it_local;
  ImVector<ImDrawChannel> *this_local;
  
  bVar6 = false;
  if (this->Data <= it) {
    bVar6 = it < this->Data + this->Size;
  }
  if (!bVar6) {
    __assert_fail("it >= Data && it < Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                  ,0x4f1,"T *ImVector<ImDrawChannel>::erase_unsorted(const T *) [T = ImDrawChannel]"
                 );
  }
  lVar4 = (long)it - (long)this->Data >> 5;
  if (it < this->Data + (long)this->Size + -1) {
    pIVar5 = this->Data + lVar4;
    pIVar2 = this->Data;
    iVar1 = this->Size;
    iVar3 = pIVar2[(long)iVar1 + -1]._CmdBuffer.Capacity;
    (pIVar5->_CmdBuffer).Size = pIVar2[(long)iVar1 + -1]._CmdBuffer.Size;
    (pIVar5->_CmdBuffer).Capacity = iVar3;
    (pIVar5->_CmdBuffer).Data = pIVar2[(long)iVar1 + -1]._CmdBuffer.Data;
    iVar3 = pIVar2[(long)iVar1 + -1]._IdxBuffer.Capacity;
    (pIVar5->_IdxBuffer).Size = pIVar2[(long)iVar1 + -1]._IdxBuffer.Size;
    (pIVar5->_IdxBuffer).Capacity = iVar3;
    (pIVar5->_IdxBuffer).Data = pIVar2[(long)iVar1 + -1]._IdxBuffer.Data;
  }
  this->Size = this->Size + -1;
  return this->Data + lVar4;
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data+Size);  const ptrdiff_t off = it - Data; if (it < Data+Size-1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }